

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall TileData::TileData(TileData *this,Tile *tile,Palette *palette)

{
  value_type_conflict vVar1;
  size_type sVar2;
  uint16_t uVar3;
  reference pvVar4;
  const_reference pvVar5;
  uint local_2c;
  uint16_t bitplanes;
  size_type sStack_28;
  uint32_t y;
  size_t writeIndex;
  Palette *palette_local;
  Tile *tile_local;
  TileData *this_local;
  
  this->_hash = 0;
  sStack_28 = 0;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    uVar3 = rowBitplanes(tile,palette,local_2c);
    pvVar4 = std::array<unsigned_char,_16UL>::operator[](&this->_data,sStack_28);
    *pvVar4 = (value_type_conflict)uVar3;
    sVar2 = sStack_28 + 1;
    if (options.bitDepth == '\x02') {
      pvVar4 = std::array<unsigned_char,_16UL>::operator[](&this->_data,sStack_28 + 1);
      *pvVar4 = (value_type_conflict)(uVar3 >> 8);
      sVar2 = sStack_28 + 2;
    }
    sStack_28 = sVar2;
    this->_hash = this->_hash ^ uVar3;
    if ((options.allowMirroring & 1U) != 0) {
      pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                         (&flipTable,(long)((int)(uint)uVar3 >> 8));
      vVar1 = *pvVar5;
      pvVar5 = std::array<unsigned_char,_256UL>::operator[](&flipTable,(long)(int)(uVar3 & 0xff));
      this->_hash = this->_hash ^ CONCAT11(vVar1,*pvVar5);
    }
  }
  return;
}

Assistant:

TileData(Png::TilesVisitor::Tile const &tile, Palette const &palette) : _hash(0) {
		size_t writeIndex = 0;
		for (uint32_t y = 0; y < 8; ++y) {
			uint16_t bitplanes = rowBitplanes(tile, palette, y);
			_data[writeIndex++] = bitplanes & 0xFF;
			if (options.bitDepth == 2) {
				_data[writeIndex++] = bitplanes >> 8;
			}

			// Update the hash
			_hash ^= bitplanes;
			if (options.allowMirroring) {
				// Count the line itself as mirrorred; vertical mirroring is
				// already taken care of because the symmetric line will be XOR'd
				// the same way. (...which is a problem, but probably benign.)
				_hash ^= flipTable[bitplanes >> 8] << 8 | flipTable[bitplanes & 0xFF];
			}
		}
	}